

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O2

void __thiscall
GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>::SymDiffSplice
          (MP<8UL,_GF2::MOGrevlex<8UL>_> *this,MP<8UL,_GF2::MOGrevlex<8UL>_> *polyRight)

{
  int iVar1;
  undefined8 in_RAX;
  iterator __position;
  int __fdout;
  __off64_t *in_R8;
  size_t in_R9;
  _List_node_base *p_Var2;
  uint in_stack_00000008;
  
  if (this == polyRight) {
    std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::clear
              (&this->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>);
    return;
  }
  __position._M_node =
       (this->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>).
       super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>._M_impl._M_node.
       super__List_node_base._M_next;
  p_Var2 = (polyRight->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>).
           super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>._M_impl._M_node.
           super__List_node_base._M_next;
  do {
    while( true ) {
      __fdout = (int)p_Var2;
      if ((__position._M_node == (_List_node_base *)this) ||
         (p_Var2 == (_List_node_base *)polyRight)) {
        if (__position._M_node != (_List_node_base *)this) {
          return;
        }
        std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::splice
                  (&this->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>,(int)this,
                   (__off64_t *)polyRight,__fdout,(__off64_t *)polyRight,in_R9,in_stack_00000008);
        return;
      }
      iVar1 = MOGrevlex<8UL>::Compare
                        ((MOGrevlex<8UL> *)&this->field_0x18,(MM<8UL> *)(__position._M_node + 1),
                         (MM<8UL> *)(p_Var2 + 1));
      if (iVar1 < 1) break;
      __position._M_node = (__position._M_node)->_M_next;
    }
    if (iVar1 < 0) {
      p_Var2 = p_Var2->_M_next;
      std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::splice
                (&this->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>,
                 (int)__position._M_node,(__off64_t *)polyRight,__fdout,in_R8,in_R9,(uint)in_RAX);
    }
    else {
      __position = std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::erase
                             (&this->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>,
                              __position._M_node);
      p_Var2 = (((list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *)&p_Var2->_M_next)->
               super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>)._M_impl._M_node.
               super__List_node_base._M_next;
    }
  } while( true );
}

Assistant:

void SymDiffSplice(MP& polyRight)
	{	
		assert(IsConsistent(polyRight));
		// к самому себе?
		if (this == &polyRight)
		{
			SetEmpty();
			return;
		}
		iterator iter = begin(), iterRight = polyRight.begin(), iterNext;
		while (iter != end() && iterRight != polyRight.end())
		{
			int cmp = _order.Compare(*iter, *iterRight);
			if (cmp > 0) ++iter;
			else 
			{
				// *iter < *iterRight?
				if (cmp < 0)
				{
					// запомнить следующий моном polyRight
					++(iterNext = iterRight);
					// перенести *iterRight перед *iter	
					splice(iter, polyRight, iterRight);
					// перейти к следующему моному polyRight
					iterRight = iterNext;
				}
				// *iter == *iterRight?
				else iter = erase(iter), ++iterRight;
			}
		}
		// добавить остаток polyRight
		if (iter == end())
			splice(end(), polyRight, iterRight, polyRight.end());
	}